

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

RealType __thiscall OpenMD::HydroProp::getScalarPitch(HydroProp *this)

{
  double dVar1;
  int i;
  RealType pScalar;
  Mat3x3d evects;
  Vector3d evals;
  Mat3x3d P;
  HydroProp *in_stack_000000f8;
  SquareMatrix3<double> *in_stack_00000210;
  Vector3<double> *in_stack_00000218;
  SquareMatrix3<double> *in_stack_00000220;
  undefined8 in_stack_ffffffffffffff18;
  __type in_stack_ffffffffffffff20;
  uint local_cc;
  double local_c8;
  Vector<double,_3U> local_68 [4];
  
  getPitchMatrix(in_stack_000000f8);
  Vector3<double>::Vector3((Vector3<double> *)0x3acef1);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3acefd);
  SquareMatrix3<double>::diagonalize(in_stack_00000220,in_stack_00000218,in_stack_00000210);
  local_c8 = 0.0;
  for (local_cc = 0; (int)local_cc < 3; local_cc = local_cc + 1) {
    Vector<double,_3U>::operator[](local_68,local_cc);
    in_stack_ffffffffffffff20 =
         std::pow<double,int>
                   (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_c8 = in_stack_ffffffffffffff20 + local_c8;
  }
  dVar1 = sqrt(local_c8 / 3.0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acfe1);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acfee);
  return dVar1;
}

Assistant:

RealType HydroProp::getScalarPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d evals;
    Mat3x3d evects;
    Mat3x3d::diagonalize(P, evals, evects);
    RealType pScalar(0.0);

    for (int i = 0; i < 3; i++) {
      pScalar += pow(evals[i], 2);
    }
    pScalar /= 3.0;

    return sqrt(pScalar);
  }